

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O0

void __thiscall
kj::anon_unknown_30::SocketAddress::SocketAddress(SocketAddress *this,void *sockaddr,uint len)

{
  Fault local_28;
  Fault f;
  uint len_local;
  void *sockaddr_local;
  SocketAddress *this_local;
  
  this->addrlen = len;
  this->wildcard = false;
  f.exception._4_4_ = len;
  if (len < 0x81) {
    memcpy(&this->addr,sockaddr,(ulong)len);
    return;
  }
  _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[40]>
            (&local_28,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++"
             ,0x1fc,FAILED,"len <= sizeof(addr)","\"Sorry, your sockaddr is too big for me.\"",
             (char (*) [40])"Sorry, your sockaddr is too big for me.");
  _::Debug::Fault::fatal(&local_28);
}

Assistant:

SocketAddress(const void* sockaddr, uint len): addrlen(len) {
    KJ_REQUIRE(len <= sizeof(addr), "Sorry, your sockaddr is too big for me.");
    memcpy(&addr.generic, sockaddr, len);
  }